

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_mod.cpp
# Opt level: O2

void Commands::SetX(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,string *set)

{
  World *pWVar1;
  pointer pbVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  Character *this;
  Character *pCVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *pmVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  uchar uVar13;
  size_t i;
  ulong uVar14;
  uint uVar15;
  string *psVar16;
  PacketBuilder *this_00;
  uint uVar17;
  PacketBuilder builder;
  allocator<char> local_142;
  allocator<char> local_141;
  string *local_140;
  key_type local_138;
  int local_114;
  string title_string;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar6 = (*from->_vptr_Command_Source[4])(from);
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this = World::GetCharacter((World *)CONCAT44(extraout_var,iVar6),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  iVar6 = (*from->_vptr_Command_Source[3])(from);
  pCVar11 = (Character *)CONCAT44(extraout_var_00,iVar6);
  if ((this == (Character *)0x0) || (this->nowhere == true)) {
    iVar6 = (*from->_vptr_Command_Source[4])(from);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"character_not_found",(allocator<char> *)&title_string);
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_01,iVar6) + 0x490),(string *)&builder);
    (*from->_vptr_Command_Source[5])(from,&local_70);
    psVar16 = &local_70;
  }
  else {
    iVar6 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar7 = (**from->_vptr_Command_Source)(from);
    if ((this == pCVar11) || ((byte)iVar6 < (byte)iVar7)) {
      if ((pCVar11 == (Character *)0x0) ||
         ((this == pCVar11 || ((pCVar11->nointeract & 0x10) == 0)))) {
        local_140 = set;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&title_string,"",(allocator<char> *)&builder);
        for (uVar14 = 1; psVar16 = local_140,
            uVar14 < (ulong)((long)(arguments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(arguments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar14 = uVar14 + 1) {
          std::__cxx11::string::append((string *)&title_string);
          if (uVar14 < ((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
            std::__cxx11::string::append((char *)&title_string);
          }
        }
        bVar5 = std::operator==(local_140,"level");
        if (bVar5) {
          iVar7 = util::to_int((arguments->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
          iVar6 = (*from->_vptr_Command_Source[4])(from);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"MaxLevel",(allocator<char> *)&local_138);
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)(CONCAT44(extraout_var_03,iVar6) + 0x198),(key_type *)&builder);
          iVar8 = util::variant::GetInt(pmVar12);
          iVar6 = 0;
          if (0 < iVar7) {
            iVar6 = iVar7;
          }
          uVar13 = (uchar)iVar6;
          if (iVar8 < iVar6) {
            uVar13 = (uchar)iVar8;
          }
          this->level = uVar13;
LAB_00119916:
          std::__cxx11::string::~string((string *)&builder);
          bVar5 = true;
LAB_00119c5a:
          Character::CalculateStats(this,true);
          PacketBuilder::PacketBuilder(&builder,PACKET_RECOVER,PACKET_LIST,0x20);
          PacketBuilder::AddShort(&builder,(uint)this->clas);
          PacketBuilder::AddShort(&builder,*this->display_str);
          PacketBuilder::AddShort(&builder,*this->display_intl);
          PacketBuilder::AddShort(&builder,*this->display_wis);
          PacketBuilder::AddShort(&builder,*this->display_agi);
          PacketBuilder::AddShort(&builder,*this->display_con);
          PacketBuilder::AddShort(&builder,*this->display_cha);
          PacketBuilder::AddShort(&builder,this->maxhp);
          PacketBuilder::AddShort(&builder,this->maxtp);
          PacketBuilder::AddShort(&builder,this->maxsp);
          PacketBuilder::AddShort(&builder,this->maxweight);
          PacketBuilder::AddShort(&builder,this->mindam);
          PacketBuilder::AddShort(&builder,this->maxdam);
          PacketBuilder::AddShort(&builder,this->accuracy);
          PacketBuilder::AddShort(&builder,this->evade);
          PacketBuilder::AddShort(&builder,this->armor);
          Character::Send(this,&builder);
          PacketBuilder::~PacketBuilder(&builder);
          bVar4 = 0;
LAB_00119da4:
          if ((bool)(bVar4 | bVar5)) {
            PacketBuilder::PacketBuilder(&builder,PACKET_RECOVER,PACKET_REPLY,0xb);
            PacketBuilder::AddInt(&builder,this->exp);
            PacketBuilder::AddShort(&builder,this->karma);
            uVar15 = 0;
            if (bVar5) {
              uVar15 = (uint)this->level;
            }
            PacketBuilder::AddChar(&builder,uVar15);
            if (bVar5) {
              PacketBuilder::AddShort(&builder,this->statpoints);
              PacketBuilder::AddShort(&builder,this->skillpoints);
            }
            Character::Send(this,&builder);
            PacketBuilder::~PacketBuilder(&builder);
          }
          Character::CheckQuestRules(this);
        }
        else {
          bVar5 = std::operator==(psVar16,"exp");
          if (bVar5) {
            iVar7 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxExp",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_04,iVar6) + 0x198),(key_type *)&builder
                                  );
            iVar8 = util::variant::GetInt(pmVar12);
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            if (iVar8 < iVar6) {
              iVar6 = iVar8;
            }
            this->exp = iVar6;
            goto LAB_00119916;
          }
          bVar5 = std::operator==(psVar16,"str");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxStat",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_06,iVar7) + 0x198),(key_type *)&builder
                                  );
            iVar7 = util::variant::GetInt(pmVar12);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->str = iVar6;
LAB_00119c50:
            bVar5 = false;
            std::__cxx11::string::~string((string *)&builder);
            goto LAB_00119c5a;
          }
          bVar5 = std::operator==(psVar16,"int");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxStat",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_07,iVar7) + 0x198),(key_type *)&builder
                                  );
            iVar7 = util::variant::GetInt(pmVar12);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->intl = iVar6;
            goto LAB_00119c50;
          }
          bVar5 = std::operator==(psVar16,"wis");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxStat",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_08,iVar7) + 0x198),(key_type *)&builder
                                  );
            iVar7 = util::variant::GetInt(pmVar12);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->wis = iVar6;
            goto LAB_00119c50;
          }
          bVar5 = std::operator==(psVar16,"agi");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxStat",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_09,iVar7) + 0x198),(key_type *)&builder
                                  );
            iVar7 = util::variant::GetInt(pmVar12);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->agi = iVar6;
            goto LAB_00119c50;
          }
          bVar5 = std::operator==(psVar16,"con");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxStat",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_10,iVar7) + 0x198),(key_type *)&builder
                                  );
            iVar7 = util::variant::GetInt(pmVar12);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->con = iVar6;
            goto LAB_00119c50;
          }
          bVar5 = std::operator==(psVar16,"cha");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxStat",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_11,iVar7) + 0x198),(key_type *)&builder
                                  );
            iVar7 = util::variant::GetInt(pmVar12);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->cha = iVar6;
            goto LAB_00119c50;
          }
          bVar5 = std::operator==(psVar16,"statpoints");
          if (bVar5) {
            iVar7 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxLevel",&local_141);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_12,iVar6) + 0x198),(key_type *)&builder
                                  );
            iVar8 = util::variant::GetInt(pmVar12);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,"StatPerLevel",&local_142);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_13,iVar6) + 0x198),&local_138);
            iVar9 = util::variant::GetInt(pmVar12);
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            if (iVar9 * iVar8 < iVar6) {
              iVar6 = iVar9 * iVar8;
            }
            this->statpoints = iVar6;
LAB_00119fc8:
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&builder);
            PacketBuilder::PacketBuilder(&builder,PACKET_RECOVER,PACKET_TARGET_GROUP,10);
            PacketBuilder::AddShort(&builder,this->statpoints);
            PacketBuilder::AddShort(&builder,this->skillpoints);
            PacketBuilder::AddShort(&builder,this->maxhp);
            PacketBuilder::AddShort(&builder,this->maxtp);
            PacketBuilder::AddShort(&builder,this->maxsp);
            Character::Send(this,&builder);
            PacketBuilder::~PacketBuilder(&builder);
LAB_0011a058:
            bVar4 = 0;
            bVar5 = false;
            goto LAB_00119da4;
          }
          bVar5 = std::operator==(psVar16,"skillpoints");
          if (bVar5) {
            iVar7 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxLevel",&local_141);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_14,iVar6) + 0x198),(key_type *)&builder
                                  );
            iVar8 = util::variant::GetInt(pmVar12);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,"SkillPerLevel",&local_142);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_15,iVar6) + 0x198),&local_138);
            iVar9 = util::variant::GetInt(pmVar12);
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            if (iVar9 * iVar8 < iVar6) {
              iVar6 = iVar9 * iVar8;
            }
            this->skillpoints = iVar6;
            goto LAB_00119fc8;
          }
          bVar5 = std::operator==(psVar16,"admin");
          if (bVar5) {
            pWVar1 = this->world;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"NoInteractDefaultAdmin",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar1->config,(key_type *)&builder);
            iVar6 = util::variant::GetInt(pmVar12);
            std::__cxx11::string::~string((string *)&builder);
            pWVar1 = this->world;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"NoInteractDefault",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar1->config,(key_type *)&builder);
            iVar7 = util::variant::GetInt(pmVar12);
            local_140 = (string *)CONCAT44(local_140._4_4_,iVar7);
            std::__cxx11::string::~string((string *)&builder);
            pWVar1 = this->world;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"hide",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar1->admin_config,(key_type *)&builder);
            local_114 = util::variant::GetInt(pmVar12);
            std::__cxx11::string::~string((string *)&builder);
            uVar10 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            uVar15 = 4;
            if ((byte)uVar10 < 4) {
              uVar15 = uVar10;
            }
            uVar17 = uVar15 & 0xff;
            if ((int)local_140 == 0) {
              bVar5 = false;
            }
            else {
              bVar5 = false;
              if ((iVar6 <= (int)(uint)this->admin) && (bVar5 = false, (int)uVar17 < iVar6)) {
                bVar5 = (this->nointeract & 1) == 0;
              }
            }
            iVar7 = (**from->_vptr_Command_Source)(from);
            if (((AdminLevel)uVar15 < (AdminLevel)iVar7) &&
               (iVar7 = (*from->_vptr_Command_Source[3])(from),
               !(bool)(this == (Character *)CONCAT44(extraout_var_16,iVar7) | bVar5))) {
              if (((int)(uint)this->admin < iVar6) &&
                 ((iVar6 <= (int)uVar17 && ((this->nointeract & 1) == 0)))) {
                this->nointeract = (int)local_140;
              }
              if ((local_114 <= (int)(uint)this->admin) && ((int)uVar17 < local_114)) {
                Character::Unhide(this,0x1f);
              }
              if ((byte)uVar10 == 0) {
                if (this->admin != ADMIN_PLAYER) {
                  World::DecAdminCount(this->world);
                }
              }
              else if (this->admin == ADMIN_PLAYER) {
                World::IncAdminCount(this->world);
              }
              this->admin = (AdminLevel)uVar15;
              goto LAB_0011a058;
            }
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"command_access_denied",(allocator<char> *)&local_138);
            I18N::Format<>(&local_d0,(I18N *)(CONCAT44(extraout_var_17,iVar6) + 0x490),
                           (string *)&builder);
            (*from->_vptr_Command_Source[5])(from,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&builder);
LAB_0011a489:
            bVar4 = 0;
            bVar5 = false;
            goto LAB_00119da4;
          }
          bVar5 = std::operator==(psVar16,"title");
          if (bVar5) {
            std::__cxx11::string::_M_assign((string *)&this->title);
            goto LAB_0011a058;
          }
          bVar5 = std::operator==(local_140,"fiance");
          if (bVar5) {
            pbVar2 = (arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&builder,"",(allocator<char> *)&local_138);
            }
            else {
              std::__cxx11::string::string((string *)&builder,(string *)(pbVar2 + 1));
            }
            std::__cxx11::string::_M_assign((string *)&this->fiance);
LAB_0011a47b:
            std::__cxx11::string::~string((string *)&builder);
            goto LAB_0011a489;
          }
          bVar5 = std::operator==(local_140,"partner");
          if (bVar5) {
            pbVar2 = (arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&builder,"",(allocator<char> *)&local_138);
            }
            else {
              std::__cxx11::string::string((string *)&builder,(string *)(pbVar2 + 1));
            }
            std::__cxx11::string::_M_assign((string *)&this->partner);
            goto LAB_0011a47b;
          }
          bVar5 = std::operator==(local_140,"home");
          if (bVar5) {
            pbVar2 = (arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&builder,"",(allocator<char> *)&local_138);
            }
            else {
              std::__cxx11::string::string((string *)&builder,(string *)(pbVar2 + 1));
            }
            std::__cxx11::string::_M_assign((string *)&this->home);
            goto LAB_0011a47b;
          }
          bVar5 = std::operator==(local_140,"gender");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            this->gender = 0 < iVar6;
LAB_0011a615:
            bVar4 = 0;
            Character::Warp(this,this->map->id,this->x,this->y,WARP_ANIMATION_NONE);
            bVar5 = false;
            goto LAB_00119da4;
          }
          bVar5 = std::operator==(local_140,"hairstyle");
          if (bVar5) {
            iVar7 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxHairStyle",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_18,iVar6) + 0x198),(key_type *)&builder
                                  );
            iVar8 = util::variant::GetInt(pmVar12);
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            if (iVar8 < iVar6) {
              iVar6 = iVar8;
            }
            this->hairstyle = (uchar)iVar6;
LAB_0011a60b:
            std::__cxx11::string::~string((string *)&builder);
            goto LAB_0011a615;
          }
          bVar5 = std::operator==(local_140,"haircolor");
          if (bVar5) {
            iVar7 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxHairColor",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_19,iVar6) + 0x198),(key_type *)&builder
                                  );
            iVar8 = util::variant::GetInt(pmVar12);
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            if (iVar8 < iVar6) {
              iVar6 = iVar8;
            }
            this->haircolor = (uchar)iVar6;
            goto LAB_0011a60b;
          }
          bVar5 = std::operator==(local_140,"race");
          if (bVar5) {
            iVar7 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"MaxSkin",(allocator<char> *)&local_138);
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_20,iVar6) + 0x198),(key_type *)&builder
                                  );
            iVar8 = util::variant::GetInt(pmVar12);
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            if (iVar8 < iVar6) {
              iVar6 = iVar8;
            }
            this->race = (Skin)iVar6;
            goto LAB_0011a60b;
          }
          bVar5 = std::operator==(local_140,"guildrank");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            uVar13 = '\t';
            if (iVar6 < 9) {
              uVar13 = (uchar)iVar6;
            }
            this->guild_rank = uVar13;
            goto LAB_0011a058;
          }
          bVar5 = std::operator==(local_140,"karma");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            bVar5 = false;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (1999 < iVar6) {
              iVar6 = 2000;
            }
            this->karma = iVar6;
            bVar4 = 1;
            goto LAB_00119da4;
          }
          bVar5 = std::operator==(local_140,"class");
          if (bVar5) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar7 = (*from->_vptr_Command_Source[4])(from);
            lVar3 = *(long *)(CONCAT44(extraout_var_21,iVar7) + 0x178);
            iVar7 = (int)((*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) / 0x38) + -1;
            bVar5 = false;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (iVar7 < iVar6) {
              iVar6 = iVar7;
            }
            this->clas = (uchar)iVar6;
            goto LAB_00119c5a;
          }
          iVar6 = (*from->_vptr_Command_Source[4])(from);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"invalid_setx",(allocator<char> *)&local_138);
          I18N::Format<>(&local_f0,(I18N *)(CONCAT44(extraout_var_22,iVar6) + 0x490),
                         (string *)&builder);
          (*from->_vptr_Command_Source[5])(from,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&builder);
        }
        this_00 = (PacketBuilder *)&title_string;
        goto LAB_001196fd;
      }
      iVar6 = (*from->_vptr_Command_Source[4])(from);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"command_access_denied",(allocator<char> *)&title_string);
      I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_05,iVar6) + 0x490),(string *)&builder)
      ;
      (*from->_vptr_Command_Source[5])(from,&local_b0);
      psVar16 = &local_b0;
    }
    else {
      iVar6 = (*from->_vptr_Command_Source[4])(from);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"command_access_denied",(allocator<char> *)&title_string);
      I18N::Format<>(&local_90,(I18N *)(CONCAT44(extraout_var_02,iVar6) + 0x490),(string *)&builder)
      ;
      (*from->_vptr_Command_Source[5])(from,&local_90);
      psVar16 = &local_90;
    }
  }
  std::__cxx11::string::~string((string *)psVar16);
  this_00 = &builder;
LAB_001196fd:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void SetX(const std::vector<std::string>& arguments, Command_Source* from, std::string set)
{
	Character *victim = from->SourceWorld()->GetCharacter(arguments[0]);
	Character *from_character = from->SourceCharacter();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
	}
	else if (victim->SourceAccess() >= from->SourceAccess() && victim != from_character)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else if (from_character && from_character != victim && !from_character->CanInteractCharMod())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else
	{
		std::string title_string = "";

		for (std::size_t i = 1; i < arguments.size(); ++i)
		{
			title_string += arguments[i];

			if (i < arguments.size() - 1)
				title_string += " ";
		}

		bool appearance = false;
		bool failure = false;
		bool level = false;
		bool stats = false;
		bool karma = false;

		bool statpoints = false;
		bool skillpoints = false;

			 if (set == "level") (level = true, victim->level) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]));
		else if (set == "exp") (level = true, victim->exp) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxExp"]));
		else if (set == "str") (stats = true, victim->str) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "int") (stats = true, victim->intl) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "wis") (stats = true, victim->wis) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "agi") (stats = true, victim->agi) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "con") (stats = true, victim->con) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "cha") (stats = true, victim->cha) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "statpoints") (statpoints = true, victim->statpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["StatPerLevel"]));
		else if (set == "skillpoints") (skillpoints = true, victim->skillpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["SkillPerLevel"]));
		else if (set == "admin")
		{
			int no_interact_default_admin = victim->world->config["NoInteractDefaultAdmin"];
			int no_interact_default = victim->world->config["NoInteractDefault"];
			int hide_level = victim->world->admin_config["hide"];

			AdminLevel level = std::min(std::max(AdminLevel(util::to_int(arguments[1])), ADMIN_PLAYER), ADMIN_HGM);

			// Avoid granting a player more privilege by lowering their admin level
			bool would_privilege = (no_interact_default != 0) && (victim->admin >= no_interact_default_admin)
			                    && (level < no_interact_default_admin) && !(victim->nointeract & Character::NoInteractCustom);

			if (level < from->SourceAccess() && victim != from->SourceCharacter() && !would_privilege)
			{
				if (victim->admin < no_interact_default_admin && level >= no_interact_default_admin
				 && !(victim->nointeract & Character::NoInteractCustom))
				{
					victim->nointeract = no_interact_default;
				}

				if (victim->admin >= hide_level && level < hide_level)
					victim->Unhide(Character::HideAll);

				if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
					victim->world->DecAdminCount();
				else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
					victim->world->IncAdminCount();

				victim->admin = level;
			}
			else
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
			}
		}
		else if (set == "title") victim->title = title_string;
		else if (set == "fiance") victim->fiance = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "partner") victim->partner = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "home") victim->home = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "gender") (appearance = true, victim->gender) = Gender(std::min(std::max(util::to_int(arguments[1]), 0), 1));
		else if (set == "hairstyle") (appearance = true, victim->hairstyle) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairStyle"]));
		else if (set == "haircolor") (appearance = true, victim->haircolor) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairColor"]));
		else if (set == "race") (appearance = true, victim->race) = Skin(std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxSkin"])));
		else if (set == "guildrank") victim->guild_rank = std::min(std::max(util::to_int(arguments[1]), 0), 9);
		else if (set == "karma") (karma = true, victim->karma) = std::min(std::max(util::to_int(arguments[1]), 0), 2000);
		else if (set == "class") (stats = true, victim->clas) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->ecf->data.size() - 1));
		else failure = true;

		if (failure)
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_setx"));
		}
		else
		{
			// Easiest way to get the character to update on everyone nearby's screen
			if (appearance)
				victim->Warp(victim->map->id, victim->x, victim->y);

			if (statpoints || skillpoints)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_TARGET_GROUP, 10);
				builder.AddShort(victim->statpoints);
				builder.AddShort(victim->skillpoints);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				victim->Send(builder);
			}

			if (level || stats)
			{
				victim->CalculateStats();

				PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);
				builder.AddShort(victim->clas);
				builder.AddShort(victim->display_str);
				builder.AddShort(victim->display_intl);
				builder.AddShort(victim->display_wis);
				builder.AddShort(victim->display_agi);
				builder.AddShort(victim->display_con);
				builder.AddShort(victim->display_cha);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				builder.AddShort(victim->maxweight);
				builder.AddShort(victim->mindam);
				builder.AddShort(victim->maxdam);
				builder.AddShort(victim->accuracy);
				builder.AddShort(victim->evade);
				builder.AddShort(victim->armor);
				victim->Send(builder);
			}

			if (karma || level)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
				builder.AddInt(victim->exp);
				builder.AddShort(victim->karma);
				builder.AddChar(level ? victim->level : 0);
				if (level)
				{
					builder.AddShort(victim->statpoints);
					builder.AddShort(victim->skillpoints);
				}
				victim->Send(builder);
			}

			victim->CheckQuestRules();
		}
	}
}